

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# receive.cpp
# Opt level: O0

CAmount wallet::OutputGetChange(CWallet *wallet,CTxOut *txout)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  CAmount *in_RSI;
  allocator<char> *in_RDI;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  CTxOut *in_stack_ffffffffffffff70;
  CWallet *in_stack_ffffffffffffff78;
  CAmount CVar2;
  char *in_stack_ffffffffffffffb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  string local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)in_stack_ffffffffffffff78,(char *)in_stack_ffffffffffffff70,
             in_stack_ffffffffffffff6c,(AnnotatedMixin<std::recursive_mutex> *)0x394b5a);
  bVar1 = MoneyRange((CAmount *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  if (bVar1) {
    bVar1 = OutputIsChange(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    if (bVar1) {
      CVar2 = *in_RSI;
    }
    else {
      CVar2 = 0;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      return CVar2;
    }
  }
  else {
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            __cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_RDI);
    std::operator+(__lhs,(char *)in_stack_ffffffffffffff78);
    std::runtime_error::runtime_error((runtime_error *)__lhs,local_28);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      __cxa_throw(__lhs,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __stack_chk_fail();
}

Assistant:

CAmount OutputGetChange(const CWallet& wallet, const CTxOut& txout)
{
    AssertLockHeld(wallet.cs_wallet);
    if (!MoneyRange(txout.nValue))
        throw std::runtime_error(std::string(__func__) + ": value out of range");
    return (OutputIsChange(wallet, txout) ? txout.nValue : 0);
}